

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void fe_sub(fe_loose *h,fe *f,fe *g)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint _assert_fe_i;
  long lVar10;
  
  lVar10 = 0;
  do {
    if (lVar10 == 5) {
      lVar10 = 0;
      do {
        if (lVar10 == 5) {
          uVar2 = f->v[4];
          uVar3 = g->v[4];
          uVar4 = f->v[1];
          uVar5 = f->v[2];
          uVar6 = f->v[3];
          uVar7 = g->v[1];
          uVar8 = g->v[2];
          uVar9 = g->v[3];
          h->v[0] = (f->v[0] - g->v[0]) + 0xfffffffffffda;
          h->v[1] = (uVar4 - uVar7) + 0xffffffffffffe;
          h->v[2] = (uVar5 - uVar8) + 0xffffffffffffe;
          h->v[3] = (uVar6 - uVar9) + 0xffffffffffffe;
          h->v[4] = (uVar2 - uVar3) + 0xffffffffffffe;
          lVar10 = 0;
          do {
            if (lVar10 == 5) {
              return;
            }
            puVar1 = h->v + lVar10;
            lVar10 = lVar10 + 1;
          } while (*puVar1 < 0x1a666666666665);
          __assert_fail("constant_time_declassify_int(h->v[_assert_fe_i] <= 0x1a666666666664UL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                        ,0xc9,"void fe_sub(fe_loose *, const fe *, const fe *)");
        }
        puVar1 = g->v + lVar10;
        lVar10 = lVar10 + 1;
      } while (*puVar1 < 0x8cccccccccccd);
      __assert_fail("constant_time_declassify_int(g->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,199,"void fe_sub(fe_loose *, const fe *, const fe *)");
    }
    puVar1 = f->v + lVar10;
    lVar10 = lVar10 + 1;
  } while (*puVar1 < 0x8cccccccccccd);
  __assert_fail("constant_time_declassify_int(f->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                ,0xc6,"void fe_sub(fe_loose *, const fe *, const fe *)");
}

Assistant:

static void fe_sub(fe_loose *h, const fe *f, const fe *g) {
  assert_fe(f->v);
  assert_fe(g->v);
  fiat_25519_sub(h->v, f->v, g->v);
  assert_fe_loose(h->v);
}